

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

path_node_type * __thiscall
jsoncons::jsonpath::detail::
eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
::create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
          (eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
           *this,basic_path_node<char> **args,unsigned_long *args_1)

{
  __single_object temp;
  unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
  local_20;
  
  std::
  make_unique<jsoncons::jsonpath::basic_path_node<char>,jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
            ((basic_path_node<char> **)&local_20,(unsigned_long *)args);
  std::
  vector<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,std::default_delete<jsoncons::jsonpath::basic_path_node<char>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,std::default_delete<jsoncons::jsonpath::basic_path_node<char>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,std::default_delete<jsoncons::jsonpath::basic_path_node<char>>>>
            ((vector<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,std::default_delete<jsoncons::jsonpath::basic_path_node<char>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,std::default_delete<jsoncons::jsonpath::basic_path_node<char>>>>>
              *)(this + 0x20),&local_20);
  std::
  unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
  ::~unique_ptr(&local_20);
  return (path_node_type *)
         (tuple<jsoncons::jsonpath::basic_path_node<char>_*,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
          )local_20._M_t.
           super___uniq_ptr_impl<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_jsoncons::jsonpath::basic_path_node<char>_*,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
           .super__Head_base<0UL,_jsoncons::jsonpath::basic_path_node<char>_*,_false>._M_head_impl;
}

Assistant:

const path_node_type* create_path_node(Args&& ... args)
        {
            auto temp = jsoncons::make_unique<path_node_type>(std::forward<Args>(args)...);
            path_node_type* ptr = temp.get();
            temp_node_values_.push_back(std::move(temp));
            return ptr;
        }